

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype.cc
# Opt level: O2

bool verona::subtype(Btypes *predicates,Btype *sub,Btype *sup,Bounds *bounds)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  Sequent seq;
  Sequent SStack_108;
  
  p_Var1 = &SStack_108.bounds._M_t._M_impl.super__Rb_tree_header;
  SStack_108.bounds._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  SStack_108.bounds._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(&SStack_108,0,0xa8);
  SStack_108.bounds._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  SStack_108.bounds._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  SStack_108.bounds._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  ::std::vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>
  ::
  insert<__gnu_cxx::__normal_iterator<std::shared_ptr<verona::BtypeDef>*,std::vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>>,void>
            ((vector<std::shared_ptr<verona::BtypeDef>,std::allocator<std::shared_ptr<verona::BtypeDef>>>
              *)&SStack_108,(const_iterator)0x0,
             (predicates->
             super__Vector_base<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (predicates->
             super__Vector_base<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  push_back(&SStack_108.lhs_pending,(value_type *)sub);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  push_back(&SStack_108.rhs_pending,(value_type *)sup);
  bVar2 = Sequent::reduce(&SStack_108);
  if (bVar2) {
    merge(bounds,&SStack_108.bounds);
  }
  Sequent::~Sequent(&SStack_108);
  return bVar2;
}

Assistant:

bool subtype(Btypes& predicates, Btype sub, Btype sup, Bounds& bounds)
  {
    Sequent seq;
    seq.lhs_pending.insert(
      seq.lhs_pending.end(), predicates.begin(), predicates.end());
    seq.lhs_pending.push_back(sub);
    seq.rhs_pending.push_back(sup);

    if (!seq.reduce())
      return false;

    merge(bounds, seq.bounds);
    return true;
  }